

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

ZSTD_CCtx * ZSTD_initStaticCCtx(void *workspace,size_t workspaceSize)

{
  int iVar1;
  ulong in_RSI;
  ZSTD_CCtx *in_RDI;
  ZSTD_cpuid_t cpuid;
  void *ptr;
  ZSTD_CCtx *cctx;
  ZSTD_CCtx *local_8;
  
  if (in_RSI < 0x391) {
    local_8 = (ZSTD_CCtx *)0x0;
  }
  else if (((ulong)in_RDI & 7) == 0) {
    memset(in_RDI,0,in_RSI);
    in_RDI->staticSize = in_RSI;
    in_RDI->workSpace = in_RDI + 1;
    in_RDI->workSpaceSize = in_RSI - 0x390;
    if (in_RDI->workSpaceSize < 0x3be0) {
      local_8 = (ZSTD_CCtx *)0x0;
    }
    else {
      (in_RDI->blockState).prevCBlock = (ZSTD_compressedBlockState_t *)in_RDI->workSpace;
      (in_RDI->blockState).nextCBlock = (in_RDI->blockState).prevCBlock + 1;
      in_RDI->entropyWorkspace = (U32 *)((in_RDI->blockState).nextCBlock + 1);
      cpuid = ZSTD_cpuid();
      iVar1 = ZSTD_cpuid_bmi2(cpuid);
      in_RDI->bmi2 = iVar1;
      local_8 = in_RDI;
    }
  }
  else {
    local_8 = (ZSTD_CCtx *)0x0;
  }
  return local_8;
}

Assistant:

ZSTD_CCtx* ZSTD_initStaticCCtx(void *workspace, size_t workspaceSize)
{
    ZSTD_CCtx* const cctx = (ZSTD_CCtx*) workspace;
    if (workspaceSize <= sizeof(ZSTD_CCtx)) return NULL;  /* minimum size */
    if ((size_t)workspace & 7) return NULL;  /* must be 8-aligned */
    memset(workspace, 0, workspaceSize);   /* may be a bit generous, could memset be smaller ? */
    cctx->staticSize = workspaceSize;
    cctx->workSpace = (void*)(cctx+1);
    cctx->workSpaceSize = workspaceSize - sizeof(ZSTD_CCtx);

    /* statically sized space. entropyWorkspace never moves (but prev/next block swap places) */
    if (cctx->workSpaceSize < HUF_WORKSPACE_SIZE + 2 * sizeof(ZSTD_compressedBlockState_t)) return NULL;
    assert(((size_t)cctx->workSpace & (sizeof(void*)-1)) == 0);   /* ensure correct alignment */
    cctx->blockState.prevCBlock = (ZSTD_compressedBlockState_t*)cctx->workSpace;
    cctx->blockState.nextCBlock = cctx->blockState.prevCBlock + 1;
    {
        void* const ptr = cctx->blockState.nextCBlock + 1;
        cctx->entropyWorkspace = (U32*)ptr;
    }
    cctx->bmi2 = ZSTD_cpuid_bmi2(ZSTD_cpuid());
    return cctx;
}